

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdpp2.c
# Opt level: O1

void update_dci_ctl(vdpp2_params *src_params)

{
  RK_S32 RVar1;
  RK_S32 RVar2;
  uint uVar3;
  VdppSrcFmtCfg *pVVar4;
  
  uVar3 = src_params->src_fmt;
  if ((uVar3 & 0xfffc) < 0x14 && (uVar3 & 0xf0000) == 0) {
    pVVar4 = vdpp_src_yuv_cfg;
  }
  else {
    if (0x1000f < (uVar3 & 0x1fff0) || (uVar3 & 0xf0000) != 0x10000) {
      _mpp_log_l(2,"vdpp2","warning: invalid input format %d",0);
      return;
    }
    uVar3 = uVar3 - 0x10000;
    pVVar4 = vdpp_src_rgb_cfg;
  }
  pVVar4 = pVVar4 + uVar3;
  RVar1 = pVVar4->alpha_swap;
  RVar2 = pVVar4->rbuv_swap;
  src_params->dci_format = pVVar4->format;
  src_params->dci_alpha_swap = RVar1;
  src_params->dci_rbuv_swap = RVar2;
  if (((byte)vdpp2_debug & 1) == 0) {
    return;
  }
  _mpp_log_l(4,"vdpp2","input format %d  dci_format %d",0);
  return;
}

Assistant:

static void update_dci_ctl(struct vdpp2_params* src_params)
{
    RK_S32 dci_format, dci_alpha_swap, dci_rbuv_swap;

    if (MPP_FRAME_FMT_IS_YUV(src_params->src_fmt)) {
        dci_format = vdpp_src_yuv_cfg[src_params->src_fmt - MPP_FRAME_FMT_YUV].format;
        dci_alpha_swap = vdpp_src_yuv_cfg[src_params->src_fmt - MPP_FRAME_FMT_YUV].alpha_swap;
        dci_rbuv_swap = vdpp_src_yuv_cfg[src_params->src_fmt - MPP_FRAME_FMT_YUV].rbuv_swap;
    } else if (MPP_FRAME_FMT_IS_RGB(src_params->src_fmt)) {
        dci_format = vdpp_src_rgb_cfg[src_params->src_fmt - MPP_FRAME_FMT_RGB].format;
        dci_alpha_swap = vdpp_src_rgb_cfg[src_params->src_fmt - MPP_FRAME_FMT_RGB].alpha_swap;
        dci_rbuv_swap = vdpp_src_rgb_cfg[src_params->src_fmt - MPP_FRAME_FMT_RGB].rbuv_swap;
    } else {
        mpp_err("warning: invalid input format %d", src_params->src_fmt);
        return;
    }

    src_params->dci_format = dci_format;
    src_params->dci_alpha_swap = dci_alpha_swap;
    src_params->dci_rbuv_swap = dci_rbuv_swap;

    VDPP2_DBG(VDPP2_DBG_TRACE, "input format %d  dci_format %d", src_params->src_fmt, dci_format);
}